

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_list.c
# Opt level: O2

adt_u32List_elem_t *
adt_u32List_elem_new(uint32_t item,adt_u32List_elem_t *pNext,adt_u32List_elem_t *pPrev)

{
  adt_u32List_elem_t *paVar1;
  int *piVar2;
  
  paVar1 = (adt_u32List_elem_t *)malloc(0x18);
  if (paVar1 == (adt_u32List_elem_t *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0xc;
  }
  else {
    paVar1->item = item;
    paVar1->pNext = pNext;
    paVar1->pPrev = pPrev;
  }
  return paVar1;
}

Assistant:

static adt_u32List_elem_t*  adt_u32List_elem_new(uint32_t item, adt_u32List_elem_t *pNext, adt_u32List_elem_t *pPrev)
{
   adt_u32List_elem_t *self = (adt_u32List_elem_t*) malloc(sizeof(adt_u32List_elem_t));
   if (self != 0)
   {
      adt_u32List_elem_create(self,item,pNext,pPrev);
   }
   else
   {
      errno = ENOMEM;
   }
   return self;
}